

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay.cpp
# Opt level: O1

bool __thiscall
ThreadedReplayer::run_creation_work_item_setup_compute
          (ThreadedReplayer *this,PipelineWorkItem *work_item)

{
  uint uVar1;
  pointer pPVar2;
  VkComputePipelineCreateInfo *info;
  bool bVar3;
  long in_FS_OFFSET;
  
  uVar1 = *(uint *)(in_FS_OFFSET + -0x18);
  pPVar2 = (this->per_thread_data).
           super__Vector_base<ThreadedReplayer::PerThreadData,_std::allocator<ThreadedReplayer::PerThreadData>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pPVar2[uVar1].current_compute_index = work_item->index + 1;
  pPVar2[uVar1].current_compute_pipeline = work_item->hash;
  info = (work_item->create_info).compute_create_info;
  if (info == (VkComputePipelineCreateInfo *)0x0) {
    run_creation_work_item_setup_compute();
  }
  else if (((info->flags & 4) == 0) || (info->basePipelineHandle != (VkPipeline)0x0)) {
    bVar3 = Fossilize::FeatureFilter::compute_pipeline_is_supported
                      (&((this->device)._M_t.
                         super___uniq_ptr_impl<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Fossilize::VulkanDevice_*,_std::default_delete<Fossilize::VulkanDevice>_>
                         .super__Head_base<0UL,_Fossilize::VulkanDevice_*,_false>._M_head_impl)->
                        feature_filter,info);
    if (bVar3) {
      mark_currently_active_modules(this,&((work_item->create_info).compute_create_info)->stage,1);
      return true;
    }
    run_creation_work_item_setup_compute((ThreadedReplayer *)work_item);
  }
  else {
    run_creation_work_item_setup_compute();
  }
  return false;
}

Assistant:

bool run_creation_work_item_setup_compute(const PipelineWorkItem &work_item)
	{
		auto &per_thread = get_per_thread_data();
		per_thread.current_compute_index = work_item.index + 1;
		per_thread.current_compute_pipeline = work_item.hash;

		if (!work_item.create_info.compute_create_info)
		{
			LOGE("Invalid compute create info.\n");
			return false;
		}

		if ((work_item.create_info.compute_create_info->flags & VK_PIPELINE_CREATE_DERIVATIVE_BIT) != 0 &&
		    work_item.create_info.compute_create_info->basePipelineHandle == VK_NULL_HANDLE)
		{
			// This pipeline failed for some reason, don't try to compile this one either.
			LOGE("Invalid derivative pipeline!\n");
			return false;
		}

		if (!device->get_feature_filter().compute_pipeline_is_supported(work_item.create_info.compute_create_info))
		{
			LOGW("Compute pipeline %016" PRIx64 " is not supported by current device, skipping.\n", work_item.hash);
			return false;
		}

		mark_currently_active_modules(&work_item.create_info.compute_create_info->stage, 1);
		return true;
	}